

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator cmp,
          Arena *arena)

{
  Node *pNVar1;
  int i;
  int n;
  long in_FS_OFFSET;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->compare_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_01156570;
  (this->compare_).comparator.user_comparator_ =
       (Comparator *)cmp.comparator.super_Comparator._vptr_Comparator._vptr_Comparator[1];
  this->arena_ = (Arena *)cmp.comparator.user_comparator_;
  local_20 = (char *)0x0;
  pNVar1 = NewNode(this,&local_20,0xc);
  this->head_ = pNVar1;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  for (n = 0; n != 0xc; n = n + 1) {
    Node::SetNext(this->head_,n,(Node *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}